

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_anydata_equal(lyd_node *first,lyd_node *second)

{
  char *pcVar1;
  hash_table *phVar2;
  char *pcVar3;
  lyd_node_anydata *anydata;
  char *str2;
  char *str1;
  lyd_node *second_local;
  lyd_node *first_local;
  
  str2 = (char *)0x0;
  anydata = (lyd_node_anydata *)0x0;
  str1 = (char *)second;
  second_local = first;
  if ((first->schema->nodetype & LYS_ANYDATA) == LYS_UNKNOWN) {
    __assert_fail("first->schema->nodetype & LYS_ANYDATA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x36,"int lyd_anydata_equal(struct lyd_node *, struct lyd_node *)");
  }
  if (first->schema->nodetype == second->schema->nodetype) {
    if (first->ht == (hash_table *)0x0) {
      lyxml_print_mem(&str2,(lyxml_elem *)first->ht,0x10);
      phVar2 = (hash_table *)lydict_insert_zc(first->schema->module->ctx,str2);
      first->ht = phVar2;
    }
    pcVar1 = str1;
    str2 = (char *)first->ht;
    if (*(long *)(str1 + 0x38) == 0) {
      lyxml_print_mem((char **)&anydata,*(lyxml_elem **)(str1 + 0x38),0x10);
      pcVar3 = lydict_insert_zc((ly_ctx *)**(undefined8 **)(*(long *)pcVar1 + 0x30),(char *)anydata)
      ;
      *(char **)(pcVar1 + 0x38) = pcVar3;
    }
    anydata = *(lyd_node_anydata **)(pcVar1 + 0x38);
    if (second_local->schema->module->ctx == (ly_ctx *)**(long **)(*(long *)str1 + 0x30)) {
      first_local._4_4_ = (uint)((lyd_node_anydata *)str2 == anydata);
    }
    else {
      first_local._4_4_ = ly_strequal_(str2,(char *)anydata);
    }
    return first_local._4_4_;
  }
  __assert_fail("first->schema->nodetype == second->schema->nodetype",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x37,"int lyd_anydata_equal(struct lyd_node *, struct lyd_node *)");
}

Assistant:

static int
lyd_anydata_equal(struct lyd_node *first, struct lyd_node *second)
{
    char *str1 = NULL, *str2 = NULL;
    struct lyd_node_anydata *anydata;

    assert(first->schema->nodetype & LYS_ANYDATA);
    assert(first->schema->nodetype == second->schema->nodetype);

    anydata = (struct lyd_node_anydata *)first;
    if (!anydata->value.str) {
        lyxml_print_mem(&str1, anydata->value.xml, LYXML_PRINT_SIBLINGS);
        anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str1);
    }
    str1 = (char *)anydata->value.str;

    anydata = (struct lyd_node_anydata *)second;
    if (!anydata->value.str) {
        lyxml_print_mem(&str2, anydata->value.xml, LYXML_PRINT_SIBLINGS);
        anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str2);
    }
    str2 = (char *)anydata->value.str;

    if (first->schema->module->ctx != second->schema->module->ctx) {
        return ly_strequal(str1, str2, 0);
    } else {
        return ly_strequal(str1, str2, 1);
    }
}